

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeData.cpp
# Opt level: O3

string * __thiscall
TPZShapeData::ShapeFunctionType_abi_cxx11_(string *__return_storage_ptr__,TPZShapeData *this)

{
  char *pcVar1;
  char *pcVar2;
  
  switch(this->fShapeType) {
  case EEmpty:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "NotInitialized";
    pcVar1 = "";
    break;
  case EScalarShape:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Scalar";
    pcVar1 = "";
    break;
  case EVecandShape:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Vector combined with Scalar";
    pcVar1 = "";
    break;
  case EVecShape:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Vector shape";
    pcVar1 = "";
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"std::string TPZShapeData::ShapeFunctionType() const",0x33);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Invalid value\n",0xe);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeData.cpp"
               ,0x18);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string TPZShapeData::ShapeFunctionType() const
{
    switch(fShapeType){
        case EEmpty:
            return "NotInitialized";
        case EScalarShape:
            return "Scalar";
        case EVecandShape:
            return "Vector combined with Scalar";
        case EVecShape:
            return "Vector shape";
        default:
            PZError<<__PRETTY_FUNCTION__;
            PZError<<"Invalid value\n";
            DebugStop();
    }
    return "All Wrong!\n";
}